

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeAtInit(Parse *pParse,Expr *pExpr,int regDest)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  ulong uVar5;
  Expr *pExpr_00;
  ExprList *pEVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  anon_union_4_2_6146edf4_for_u *paVar10;
  
  pEVar6 = pParse->pConstExpr;
  uVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),regDest < 0);
  iVar4 = (int)uVar5;
  if (pEVar6 != (ExprList *)0x0 && regDest < 0) {
    iVar8 = pEVar6->nExpr;
    bVar1 = iVar8 < 1;
    if (0 < iVar8) {
      paVar10 = &pEVar6->a[0].u;
      iVar8 = iVar8 + 1;
      do {
        if ((paVar10->iConstExprReg & 0x40000000000U) != 0) {
          uVar3 = sqlite3ExprCompare((Parse *)0x0,((ExprList_item *)(paVar10 + -7))->pExpr,pExpr,-1)
          ;
          uVar5 = (ulong)uVar3;
          if (uVar3 == 0) {
            iVar4 = paVar10->iConstExprReg;
            break;
          }
        }
        iVar4 = (int)uVar5;
        iVar9 = iVar8 + -1;
        paVar10 = paVar10 + 8;
        iVar2 = iVar8 + -3;
        bVar1 = iVar9 < 2;
        iVar8 = iVar9;
      } while (SBORROW4(iVar9,2) == iVar2 < 0);
    }
    if (!bVar1) {
      return iVar4;
    }
  }
  if (pExpr == (Expr *)0x0) {
    pExpr_00 = (Expr *)0x0;
  }
  else {
    pExpr_00 = exprDup(pParse->db,pExpr,0,(u8 **)0x0);
  }
  pEVar6 = sqlite3ExprListAppend(pParse,pEVar6,pExpr_00);
  if (pEVar6 != (ExprList *)0x0) {
    lVar7 = (long)pEVar6->nExpr;
    pEVar6->a[lVar7 + -1].field_0x19 =
         pEVar6->a[lVar7 + -1].field_0x19 & 0xfb | (byte)((uint)regDest >> 0x1d) & 4;
    if (regDest < 0) {
      regDest = pParse->nMem + 1;
      pParse->nMem = regDest;
    }
    pEVar6->a[lVar7 + -1].u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = pEVar6;
  return regDest;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeAtInit(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->reusable && sqlite3ExprCompare(0,pItem->pExpr,pExpr,-1)==0 ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  p = sqlite3ExprListAppend(pParse, p, pExpr);
  if( p ){
     struct ExprList_item *pItem = &p->a[p->nExpr-1];
     pItem->reusable = regDest<0;
     if( regDest<0 ) regDest = ++pParse->nMem;
     pItem->u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = p;
  return regDest;
}